

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O3

uint64_t helper_neon_qadd_u64_arm(CPUARMState *env,uint64_t src1,uint64_t src2)

{
  uint64_t uVar1;
  
  uVar1 = src1 + src2;
  if (CARRY8(src1,src2)) {
    (env->vfp).qc[0] = 1;
    uVar1 = 0xffffffffffffffff;
  }
  return uVar1;
}

Assistant:

uint64_t HELPER(neon_qadd_u64)(CPUARMState *env, uint64_t src1, uint64_t src2)
{
    uint64_t res;

    res = src1 + src2;
    if (res < src1) {
        SET_QC();
        res = ~(uint64_t)0;
    }
    return res;
}